

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O0

int shuffle_argv(int argc,char **argv,option *longopts,custom_getopt_data *d)

{
  int iVar1;
  custom_getopt_data *in_RCX;
  long in_RDX;
  char **in_RSI;
  int in_EDI;
  bool bVar2;
  bool local_23;
  int local_4;
  
  if (in_RCX->custom_optind < in_RCX->last_nonopt) {
    in_RCX->last_nonopt = in_RCX->custom_optind;
  }
  if (in_RCX->custom_optind < in_RCX->first_nonopt) {
    in_RCX->first_nonopt = in_RCX->custom_optind;
  }
  if ((in_RCX->first_nonopt == in_RCX->last_nonopt) ||
     (in_RCX->last_nonopt == in_RCX->custom_optind)) {
    if (in_RCX->last_nonopt != in_RCX->custom_optind) {
      in_RCX->first_nonopt = in_RCX->custom_optind;
    }
  }
  else {
    exchange(in_RSI,in_RCX);
  }
  while( true ) {
    bVar2 = false;
    if ((in_RCX->custom_optind < in_EDI) && (bVar2 = true, *in_RSI[in_RCX->custom_optind] == '-')) {
      bVar2 = in_RSI[in_RCX->custom_optind][1] == '\0';
    }
    if (!bVar2) break;
    in_RCX->custom_optind = in_RCX->custom_optind + 1;
  }
  in_RCX->last_nonopt = in_RCX->custom_optind;
  if ((in_RCX->custom_optind != in_EDI) &&
     (iVar1 = strcmp(in_RSI[in_RCX->custom_optind],"--"), iVar1 == 0)) {
    in_RCX->custom_optind = in_RCX->custom_optind + 1;
    if ((in_RCX->first_nonopt == in_RCX->last_nonopt) ||
       (in_RCX->last_nonopt == in_RCX->custom_optind)) {
      if (in_RCX->first_nonopt == in_RCX->last_nonopt) {
        in_RCX->first_nonopt = in_RCX->custom_optind;
      }
    }
    else {
      exchange(in_RSI,in_RCX);
    }
    in_RCX->last_nonopt = in_EDI;
    in_RCX->custom_optind = in_EDI;
  }
  if (in_RCX->custom_optind == in_EDI) {
    if (in_RCX->first_nonopt != in_RCX->last_nonopt) {
      in_RCX->custom_optind = in_RCX->first_nonopt;
    }
    local_4 = -1;
  }
  else if ((*in_RSI[in_RCX->custom_optind] == '-') && (in_RSI[in_RCX->custom_optind][1] != '\0')) {
    local_23 = false;
    if (in_RDX != 0) {
      local_23 = in_RSI[in_RCX->custom_optind][1] == '-';
    }
    in_RCX->nextchar = in_RSI[in_RCX->custom_optind] + (long)(int)(uint)local_23 + 1;
    local_4 = 0;
  }
  else {
    iVar1 = in_RCX->custom_optind;
    in_RCX->custom_optind = iVar1 + 1;
    in_RCX->custom_optarg = in_RSI[iVar1];
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int shuffle_argv(int argc, char *const *argv,const struct option *longopts,
	struct custom_getopt_data *d)
{
	/*
	 * Give FIRST_NONOPT & LAST_NONOPT rational values if CUSTOM_OPTIND has been
	 * moved back by the user (who may also have changed the arguments).
	 */
	if (d->last_nonopt > d->custom_optind)
		d->last_nonopt = d->custom_optind;
	if (d->first_nonopt > d->custom_optind)
		d->first_nonopt = d->custom_optind;
	/*
	 * If we have just processed some options following some
	 * non-options, exchange them so that the options come first.
	 */
	if (d->first_nonopt != d->last_nonopt &&
			d->last_nonopt != d->custom_optind)
		exchange((char **) argv, d);
	else if (d->last_nonopt != d->custom_optind)
		d->first_nonopt = d->custom_optind;
	/*
	 * Skip any additional non-options and extend the range of
	 * non-options previously skipped.
	 */
	while (d->custom_optind < argc && NONOPTION_P)
		d->custom_optind++;
	d->last_nonopt = d->custom_optind;
	/*
	 * The special ARGV-element `--' means premature end of options.  Skip
	 * it like a null option, then exchange with previous non-options as if
	 * it were an option, then skip everything else like a non-option.
	 */
	if (d->custom_optind != argc && !strcmp(argv[d->custom_optind], "--")) {
		d->custom_optind++;
		if (d->first_nonopt != d->last_nonopt
				&& d->last_nonopt != d->custom_optind)
			exchange((char **) argv, d);
		else if (d->first_nonopt == d->last_nonopt)
			d->first_nonopt = d->custom_optind;
		d->last_nonopt = argc;
		d->custom_optind = argc;
	}
	/*
	 * If we have done all the ARGV-elements, stop the scan and back over
	 * any non-options that we skipped and permuted.
	 */
	if (d->custom_optind == argc) {
		/*
		 * Set the next-arg-index to point at the non-options that we
		 * previously skipped, so the caller will digest them.
		 */
		if (d->first_nonopt != d->last_nonopt)
			d->custom_optind = d->first_nonopt;
		return -1;
	}
	/*
	 * If we have come to a non-option and did not permute it, either stop
	 * the scan or describe it to the caller and pass it by.
	 */
	if (NONOPTION_P) {
		d->custom_optarg = argv[d->custom_optind++];
		return 1;
	}
	/*
	 * We have found another option-ARGV-element. Skip the initial
	 * punctuation.
	 */
	d->nextchar = (argv[d->custom_optind] + 1 + (longopts != NULL && argv[d->custom_optind][1] == '-'));
	return 0;
}